

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

bool __thiscall ArgParser::ArgIterator::match(ArgIterator *this,char *name)

{
  bool bVar1;
  range_error *this_00;
  size_t sVar2;
  size_t sVar3;
  size_t namelen;
  char *name_local;
  ArgIterator *this_local;
  
  if (this->i == this->argc) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"arg out of range");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  sVar2 = stringlength<char>(name);
  sVar3 = stringlength<char>(this->p);
  if (sVar3 < sVar2) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::equal<char_const*,char_const*>(name,name + sVar2,this->p);
    if (bVar1) {
      this->p = this->p + sVar2;
      this->longmatch = true;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool match(const char*name)
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            auto namelen = stringlength(name);
            if (namelen > stringlength(p))
                return false;
            if (std::equal(name, name+namelen, p)) {
                p += namelen;
                longmatch = true;
                return true;
            }
            return false;
        }